

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall kratos::VarCasted::VarCasted(VarCasted *this,Var *parent,VarCastType cast_type)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  uint32_t var_width;
  undefined4 extraout_var;
  VarException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar4;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_c0;
  Var *local_a0;
  pointer local_98;
  size_type sStack_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_60;
  string local_58;
  allocator_type local_31;
  
  iVar3 = (*(parent->super_IRNode)._vptr_IRNode[0xd])(parent);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  var_width = (*(parent->super_IRNode)._vptr_IRNode[7])(parent);
  local_60 = &parent->size_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,local_60);
  aVar4.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)0x0;
  Var::Var(&this->super_Var,(Generator *)CONCAT44(extraout_var,iVar3),&local_58,var_width,&local_78,
           false,parent->type_);
  if (local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002ad608;
  (this->super_EnumType)._vptr_EnumType = (_func_int **)&DAT_002ad778;
  this->parent_var_ = parent;
  this->cast_type_ = cast_type;
  this->enum_type_ = (Enum *)0x0;
  this->target_width_ = 0;
  (this->super_Var).type_ = BaseCasted;
  if (cast_type - Clock < 2) {
    puVar1 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (((long)(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 != 4) || (*puVar1 != 1)) {
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      (*(parent->super_IRNode)._vptr_IRNode[0x1f])(&local_98,parent);
      local_58.field_2._M_allocated_capacity =
           (size_type)
           *(local_60->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
      local_58._M_dataplus._M_p = local_98;
      local_58._M_string_length = sStack_90;
      format_str.size_ = 0x2d;
      format_str.data_ = (char *)0x3c;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = aVar4.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_58;
      fmt::v7::detail::vformat_abi_cxx11_
                (&local_c0,(detail *)"Can only cast bit width 1 to Clock or AsyncReset. {0} is {1}",
                 format_str,args);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_a0;
      local_a0 = parent;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_58,__l,&local_31);
      VarException::VarException
                (this_00,&local_c0,
                 (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                 &local_58);
      __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (cast_type == Signed) {
      bVar2 = true;
    }
    else {
      if (cast_type != Unsigned) {
        return;
      }
      bVar2 = false;
    }
    (this->super_Var).is_signed_ = bVar2;
  }
  return;
}

Assistant:

VarCasted::VarCasted(Var *parent, VarCastType cast_type)
    : Var(parent->generator(), "", parent->width(), parent->size(), false, parent->type()),
      parent_var_(parent),
      cast_type_(cast_type) {
    type_ = VarType::BaseCasted;
    if (cast_type_ == VarCastType::Signed) {
        is_signed_ = true;
    } else if (cast_type_ == VarCastType::Unsigned) {
        is_signed_ = false;
    } else if (cast_type_ == VarCastType::AsyncReset || cast_type_ == VarCastType::Clock) {
        if (parent->size().size() != 1 || parent->size().front() != 1) {
            throw VarException(::format("Can only cast bit width 1 to "
                                        "Clock or AsyncReset. {0} is {1}",
                                        parent->to_string(), parent->size().front()),
                               {parent});
        }
    }
}